

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O2

void __thiscall
ktx::OptionsEncodeBasis<true>::captureCodecOption(OptionsEncodeBasis<true> *this,char *name)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_48;
  char *local_28 [3];
  
  fmt.size_ = 0xc;
  fmt.data_ = (char *)0x5;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  local_28[0] = name;
  ::fmt::v10::vformat_abi_cxx11_(&sStack_48,(v10 *)0x1da110,fmt,args);
  std::__cxx11::string::append((string *)&this->codecOptions);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void captureCodecOption(const char* name) {
        codecOptions += fmt::format(" --{}", name);
    }